

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::v1_14::InstAPI::queryRWInfo
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  ulong in_RCX;
  char in_DIL;
  InstRWInfo *in_stack_00000098;
  size_t in_stack_000000a0;
  Operand_ *in_stack_000000a8;
  BaseInst *in_stack_000000b0;
  InstRWInfo *in_stack_00000200;
  size_t in_stack_00000208;
  Operand_ *in_stack_00000210;
  BaseInst *in_stack_00000218;
  Arch in_stack_00000223;
  bool local_32;
  bool local_31;
  Error local_8;
  
  if (in_RCX < 7) {
    local_31 = in_DIL == '\x01' || in_DIL == '\x02';
    if (local_31) {
      local_8 = x86::InstInternal::queryRWInfo
                          (in_stack_00000223,in_stack_00000218,in_stack_00000210,in_stack_00000208,
                           in_stack_00000200);
    }
    else {
      local_32 = in_DIL == '\x06' || in_DIL == '\f';
      if (local_32) {
        local_8 = a64::InstInternal::queryRWInfo
                            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098
                            );
      }
      else {
        local_8 = DebugUtils::errored(4);
      }
    }
  }
  else {
    local_8 = DebugUtils::errored(2);
  }
  return local_8;
}

Assistant:

Error InstAPI::queryRWInfo(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  if (ASMJIT_UNLIKELY(opCount > Globals::kMaxOpCount))
    return DebugUtils::errored(kErrorInvalidArgument);

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::queryRWInfo(arch, inst, operands, opCount, out);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::queryRWInfo(inst, operands, opCount, out);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}